

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall r_exec::PGMController::PGMController(PGMController *this,View *ipgm_view)

{
  PGMOverlay *this_00;
  P<r_exec::Overlay> local_20;
  View *local_18;
  View *ipgm_view_local;
  PGMController *this_local;
  
  local_18 = ipgm_view;
  ipgm_view_local = (View *)this;
  _PGMController::_PGMController(&this->super__PGMController,ipgm_view);
  (this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__PGMController_002ecee8;
  this_00 = (PGMOverlay *)operator_new(0xe8);
  PGMOverlay::PGMOverlay(this_00,(Controller *)this);
  core::P<r_exec::Overlay>::P(&local_20,(Overlay *)this_00);
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super__PGMController).super_OController.overlays,&local_20);
  core::P<r_exec::Overlay>::~P(&local_20);
  return;
}

Assistant:

PGMController::PGMController(r_code::View *ipgm_view): _PGMController(ipgm_view)
{
    overlays.push_back(new PGMOverlay(this));
}